

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool cpu_breakpoint_test(CPUState *cpu,vaddr pc,int mask)

{
  CPUBreakpoint *local_30;
  CPUBreakpoint *bp;
  int mask_local;
  vaddr pc_local;
  CPUState *cpu_local;
  
  if ((cpu->breakpoints).tqh_first != (CPUBreakpoint *)0x0) {
    for (local_30 = (cpu->breakpoints).tqh_first; local_30 != (CPUBreakpoint *)0x0;
        local_30 = (local_30->entry).tqe_next) {
      if ((local_30->pc == pc) && ((local_30->flags & mask) != 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static inline bool cpu_breakpoint_test(CPUState *cpu, vaddr pc, int mask)
{
    CPUBreakpoint *bp;

    if (unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
        QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
            if (bp->pc == pc && (bp->flags & mask)) {
                return true;
            }
        }
    }
    return false;
}